

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

char * nn_symbol(int i,int *value)

{
  int *piVar1;
  nn_symbol_properties *svn;
  int *value_local;
  char *pcStack_10;
  int i_local;
  
  if ((i < 0) || (0x77 < i)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    pcStack_10 = (char *)0x0;
  }
  else {
    if (value != (int *)0x0) {
      *value = sym_value_names[i].value;
    }
    pcStack_10 = sym_value_names[i].name;
  }
  return pcStack_10;
}

Assistant:

const char *nn_symbol (int i, int *value)
{
    const struct nn_symbol_properties *svn;
    if (i < 0 || i >= SYM_VALUE_NAMES_LEN) {
        errno = EINVAL;
        return NULL;
    }

    svn = &sym_value_names [i];
    if (value)
        *value = svn->value;
    return svn->name;
}